

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

void __thiscall Exception::~Exception(Exception *this)

{
  Exception *this_local;
  
  *(undefined ***)this = &PTR__Exception_0013ad68;
  if (this->err_msg != (char *)0x0) {
    operator_delete__(this->err_msg);
  }
  std::__cxx11::string::~string((string *)&this->err_word);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

Exception::~Exception() {
    delete []err_msg;
}